

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlistwidget.cpp
# Opt level: O1

QMimeData * __thiscall QListModel::mimeData(QListModel *this,QModelIndexList *indexes)

{
  ulong uVar1;
  long *plVar2;
  QMimeData *pQVar3;
  long lVar4;
  uint uVar5;
  ulong uVar6;
  long in_FS_OFFSET;
  QList<QListWidgetItem_*> local_58;
  QListWidgetItem *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58.d.d = (Data *)0x0;
  local_58.d.ptr = (QListWidgetItem **)0x0;
  local_58.d.size = 0;
  uVar5 = (uint)(indexes->d).size;
  QList<QListWidgetItem_*>::reserve(&local_58,(long)(int)uVar5);
  if (0 < (int)uVar5) {
    uVar6 = (ulong)(uVar5 & 0x7fffffff);
    lVar4 = 0;
    do {
      uVar1 = (ulong)*(int *)((long)&((indexes->d).ptr)->r + lVar4);
      if (uVar1 < (ulong)(this->items).d.size) {
        local_40 = (this->items).d.ptr[uVar1];
      }
      else {
        local_40 = (QListWidgetItem *)0x0;
      }
      QtPrivate::QPodArrayOps<QListWidgetItem*>::emplace<QListWidgetItem*&>
                ((QPodArrayOps<QListWidgetItem*> *)&local_58,local_58.d.size,&local_40);
      QList<QListWidgetItem_*>::end(&local_58);
      lVar4 = lVar4 + 0x18;
      uVar6 = uVar6 - 1;
    } while (uVar6 != 0);
  }
  QArrayDataPointer<QModelIndex>::operator=(&(this->cachedIndexes).d,&indexes->d);
  plVar2 = (long *)QMetaObject::cast((QObject *)&QListWidget::staticMetaObject);
  pQVar3 = (QMimeData *)(**(code **)(*plVar2 + 0x308))(plVar2,&local_58);
  QList<QModelIndex>::clear(&this->cachedIndexes);
  if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,8,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return pQVar3;
  }
  __stack_chk_fail();
}

Assistant:

QMimeData *QListModel::mimeData(const QModelIndexList &indexes) const
{
    QList<QListWidgetItem*> itemlist;
    const int indexesCount = indexes.size();
    itemlist.reserve(indexesCount);
    for (int i = 0; i < indexesCount; ++i)
        itemlist << at(indexes.at(i).row());

    cachedIndexes = indexes;
    QMimeData *mimeData = view()->mimeData(itemlist);
    cachedIndexes.clear();
    return mimeData;
}